

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_bytedata160.cpp
# Opt level: O2

void __thiscall
ByteData160_BytesConstructorException_Test::TestBody
          (ByteData160_BytesConstructorException_Test *this)

{
  char *in_R9;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  sStack_58;
  AssertHelper local_50;
  vector<unsigned_char,_std::allocator<unsigned_char>_> target;
  ByteData160 byte_data;
  
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&target,0x19,(allocator_type *)&byte_data);
  cfd::core::ByteData160::ByteData160(&byte_data,&target);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&byte_data);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&target.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  byte_data.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start._0_1_ = 0;
  byte_data.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  testing::Message::Message((Message *)&sStack_58);
  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
            ((string *)&target,(internal *)&byte_data,(AssertionResult *)0x43d6e7,"false","true",
             in_R9);
  testing::internal::AssertHelper::AssertHelper
            (&local_50,kFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_bytedata160.cpp"
             ,0x61,(char *)target.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                           _M_impl.super__Vector_impl_data._M_start);
  testing::internal::AssertHelper::operator=(&local_50,(Message *)&sStack_58);
  testing::internal::AssertHelper::~AssertHelper(&local_50);
  std::__cxx11::string::~string((string *)&target);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr(&sStack_58);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&byte_data.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_finish);
  return;
}

Assistant:

TEST(ByteData160, BytesConstructorException) {
  try {
    std::vector<uint8_t> target(25);
    ByteData160 byte_data = ByteData160(target);
  } catch (const cfd::core::CfdException &cfd_except) {
    EXPECT_STREQ(cfd_except.what(), "ByteData160 size unmatch.");
    return;
  }
  ASSERT_TRUE(false);
}